

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_files,char **file_name)

{
  bool bVar1;
  CaptureSummary **cs;
  long *plVar2;
  CaptureSummary *pCVar3;
  size_t i;
  long lVar4;
  size_t sVar5;
  CaptureSummary *pCVar6;
  size_t i_1;
  ulong uVar7;
  
  uVar7 = nb_files + 1;
  cs = (CaptureSummary **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
  plVar2 = (long *)operator_new__(-(ulong)(uVar7 >> 0x3b != 0) | uVar7 * 0x20 | 8);
  pCVar3 = (CaptureSummary *)(plVar2 + 1);
  lVar4 = nb_files + 1;
  *plVar2 = lVar4;
  if (lVar4 != 0) {
    pCVar6 = pCVar3;
    do {
      pCVar6->capture_version = 0xcd;
      (pCVar6->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pCVar6->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pCVar6->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != pCVar3 + lVar4);
  }
  for (sVar5 = 0; nb_files != sVar5; sVar5 = sVar5 + 1) {
    cs[sVar5] = pCVar3;
    pCVar3 = pCVar3 + 1;
  }
  bVar1 = true;
  for (uVar7 = 0; (bVar1 != false && (uVar7 < nb_files)); uVar7 = uVar7 + 1) {
    bVar1 = Load(cs[uVar7],file_name[uVar7]);
  }
  if (bVar1 != false) {
    bVar1 = Merge(this,nb_files,cs);
  }
  if (*plVar2 != 0) {
    lVar4 = *plVar2 << 5;
    do {
      ~CaptureSummary((CaptureSummary *)((long)plVar2 + lVar4 + -0x18));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != 0);
  }
  operator_delete__(plVar2);
  operator_delete__(cs);
  return bVar1;
}

Assistant:

bool CaptureSummary::Merge(size_t nb_files, char const ** file_name)
{
    CaptureSummary ** list = new  CaptureSummary*[nb_files + 1];
    CaptureSummary * baselist = new  CaptureSummary[nb_files + 1];

    bool ret = list != NULL && baselist != NULL;

    if (ret)
    {
        for (size_t i = 0; ret && i < nb_files; i++)
        {
            list[i] = &baselist[i];
        }
    }

    for (size_t i=0; ret && i < nb_files; i++)
    {
        ret = list[i]->Load(file_name[i]);
    }

    if (ret)
    {
        ret = Merge(nb_files, list);
    }

    if (baselist != NULL)
    {
        delete[] baselist;
    }

    if (list != NULL)
    {
        delete[] list;
    }

    return ret;
}